

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test7(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  CMReturn In;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_22d0;
  allocator<unsigned_long> local_2281;
  unsigned_long local_2280 [2];
  iterator local_2270;
  size_type local_2268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2260;
  allocator<unsigned_long> local_2241;
  unsigned_long local_2240 [2];
  iterator local_2230;
  size_type local_2228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2220;
  uint64_t local_2208;
  uint64_t uStack_2200;
  uint64_t local_21f8;
  pointer local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  allocator<char> local_21b1;
  string local_21b0;
  string local_2190;
  undefined1 auStack_2170 [8];
  CMReturn res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2148;
  string local_2128 [32];
  string local_2108 [32];
  iterator local_20e8;
  size_type local_20e0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a0;
  undefined1 local_2088 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  allocator<char> local_41;
  string local_40 [8];
  string in;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  GetDefaultMap_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,anon_var_dwarf_15a82,&local_41);
  std::allocator<char>::~allocator(&local_41);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20a0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)&in.field_2 + 8));
  res._20_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2148,"_",(allocator<char> *)&res.field_0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2128,"%",(allocator<char> *)&res.field_0x16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2108,"$",(allocator<char> *)&res.field_0x15);
  res._20_1_ = 0;
  local_20e8 = &local_2148;
  local_20e0 = 3;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&res.Status + 1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_01._M_len = local_20e0;
  __l_01._M_array = local_20e8;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_20d8,__l_01,0,(hasher *)((long)&res.Status + 3),
                  (key_equal *)((long)&res.Status + 2),this);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2088,&local_20a0,&local_20d8,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_20d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&res.Status + 1));
  local_22d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20e8;
  do {
    local_22d0 = local_22d0 + -1;
    std::__cxx11::string::~string((string *)local_22d0);
  } while (local_22d0 != &local_2148);
  std::allocator<char>::~allocator((allocator<char> *)&res.field_0x15);
  std::allocator<char>::~allocator((allocator<char> *)&res.field_0x16);
  std::allocator<char>::~allocator((allocator<char> *)&res.field_0x17);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20a0);
  std::__cxx11::string::string((string *)&local_2190,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21b0,"NIGGER",&local_21b1);
  local_21c8 = 0;
  uStack_21c0 = 0;
  local_21d8 = 0;
  uStack_21d0 = 1000000;
  local_21e8 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_21e0 = 0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_2170,(ConfusableMatcher *)local_2088,&local_2190,&local_21b0,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,ZEXT824(matcher.TheMap[0xff].
                                                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
                     ));
  std::__cxx11::string::~string((string *)&local_21b0);
  std::allocator<char>::~allocator(&local_21b1);
  std::__cxx11::string::~string((string *)&local_2190);
  local_21f8 = res.Size;
  local_2208 = (uint64_t)auStack_2170;
  uStack_2200 = res.Start;
  local_2240[0] = 0x40;
  local_2240[1] = 0x59;
  local_2230 = local_2240;
  local_2228 = 2;
  std::allocator<unsigned_long>::allocator(&local_2241);
  __l_00._M_len = local_2228;
  __l_00._M_array = local_2230;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2220,__l_00,&local_2241)
  ;
  local_2280[0] = 0x39;
  local_2280[1] = 0x20;
  local_2270 = local_2280;
  local_2268 = 2;
  std::allocator<unsigned_long>::allocator(&local_2281);
  __l._M_len = local_2268;
  __l._M_array = local_2270;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2260,__l,&local_2281);
  In.Size = uStack_2200;
  In.Start = local_2208;
  In._16_8_ = local_21f8;
  AssertMatchMulti(In,&local_2220,&local_2260,MATCH);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2260);
  std::allocator<unsigned_long>::~allocator(&local_2281);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2220);
  std::allocator<unsigned_long>::~allocator(&local_2241);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2088);
  std::__cxx11::string::~string(local_40);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&in.field_2 + 8));
  return;
}

Assistant:

void Test7()
{
	auto map = GetDefaultMap();

	std::string in = "AAAAAAAAASSAFSAFNFNFNISFNSIFSIFJSDFUDSHF ASUF/|/__/|/___%/|/%I%%/|//|/%%%%%NNNN/|/NN__/|/N__𝘪G___%____$__G__𝓰𝘦Ѓ";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, { "_", "%", "$" });
	auto res = matcher.IndexOf(in, "NIGGER", opts);

	AssertMatchMulti(res, { 64, 89 }, { 57, 32 });
}